

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cc
# Opt level: O3

void __thiscall
sentencepiece::util::Status::Status(Status *this,StatusCode code,string_view error_message)

{
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> _Var1;
  pointer *__ptr;
  long *local_48 [2];
  long local_38 [2];
  
  _Var1._M_head_impl = (Rep *)operator_new(0x28);
  ((_Var1._M_head_impl)->error_message)._M_dataplus =
       (pointer)((long)&(_Var1._M_head_impl)->error_message + 0x10);
  *(undefined8 *)((long)&(_Var1._M_head_impl)->error_message + 8) = kOk;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(_Var1._M_head_impl)->error_message + 0x10))->_M_local_buf[0] = kOk;
  (this->rep_)._M_t.
  super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
  .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl =
       _Var1._M_head_impl;
  (_Var1._M_head_impl)->code = code;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,error_message._M_str,error_message._M_str + error_message._M_len);
  std::__cxx11::string::operator=
            ((string *)
             &((this->rep_)._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl)->
              error_message,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

Status::Status(StatusCode code, absl::string_view error_message)
    : rep_(new Rep) {
  rep_->code = code;
  rep_->error_message = std::string(error_message);
}